

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::EncodeTextureCoordinates(ObjEncoder *this)

{
  EncoderBuffer *pEVar1;
  bool bVar2;
  PointAttribute *this_00;
  AttributeValueIndex att_id;
  bool bVar3;
  array<float,_2UL> value;
  float afStack_38 [2];
  
  this_00 = PointCloud::GetNamedAttribute(this->in_point_cloud_,TEX_COORD);
  bVar3 = true;
  if ((this_00 != (PointAttribute *)0x0) && (this_00->num_unique_entries_ != 0)) {
    bVar3 = this_00->num_unique_entries_ == 0;
    if (bVar3) {
LAB_00110a5f:
      this->tex_coord_att_ = this_00;
    }
    else {
      bVar2 = GeometryAttribute::ConvertValue<float>
                        (&this_00->super_GeometryAttribute,(AttributeValueIndex)0x0,'\x02',
                         afStack_38);
      if (bVar2) {
        att_id.value_ = 1;
        do {
          pEVar1 = this->out_buffer_;
          if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar1,
                       (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,"vt ","");
          }
          EncodeFloatList(this,afStack_38,2);
          pEVar1 = this->out_buffer_;
          if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar1,
                       (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,"\n","");
          }
          bVar3 = this_00->num_unique_entries_ <= att_id.value_;
          if (bVar3) goto LAB_00110a5f;
          bVar2 = GeometryAttribute::ConvertValue<float>
                            (&this_00->super_GeometryAttribute,att_id,'\x02',afStack_38);
          att_id.value_ = att_id.value_ + 1;
        } while (bVar2);
      }
    }
  }
  return bVar3;
}

Assistant:

bool ObjEncoder::EncodeTextureCoordinates() {
  const PointAttribute *const att =
      in_point_cloud_->GetNamedAttribute(GeometryAttribute::TEX_COORD);
  if (att == nullptr || att->size() == 0) {
    return true;  // It's OK if we don't have texture coordinates.
  }
  std::array<float, 2> value;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(att->size()); ++i) {
    if (!att->ConvertValue<float, 2>(i, &value[0])) {
      return false;
    }
    buffer()->Encode("vt ", 3);
    EncodeFloatList(&value[0], 2);
    buffer()->Encode("\n", 1);
  }
  tex_coord_att_ = att;
  return true;
}